

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall
__gnu_cxx::__ops::
_Iter_negate<helics::TimeDependencies::checkIfReadyForTimeGrant(bool,TimeRepresentation<count_time<9,long>>,helics::GrantDelayMode)const::$_0>
::operator()(_Iter_negate<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_TimeDependencies_cpp:560:28)>
             *this,__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   __it)

{
  TimeState TVar1;
  long lVar2;
  long lVar3;
  
  if ((__it._M_current)->dependency == true) {
    lVar2 = ((__it._M_current)->super_TimeData).next.internalTimeCode;
    if (lVar2 == 0x7fffffffffffffff) {
      return false;
    }
    if ((__it._M_current)->connection == SELF) {
      return false;
    }
    lVar3 = (this->_M_pred).desiredGrantTime.internalTimeCode;
    if (lVar2 < lVar3) {
      return true;
    }
    TVar1 = ((__it._M_current)->super_TimeData).mTimeState;
    if (lVar2 == lVar3 && TVar1 == time_granted) {
      return true;
    }
    if (((TVar1 & ~exec_requested_require_iteration) == time_requested_require_iteration &&
         (this->_M_pred).delayMode == WAITING) &&
       (((__it._M_current)->super_TimeData).sequenceCounter <
        ((__it._M_current)->super_TimeData).grantedIteration)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool iteratingTimeGrantCheck(const DependencyInfo& dep,
                                    Time desiredGrantTime,
                                    GrantDelayMode delayMode)
{
    if (!dep.dependency || dep.next >= cBigTime) {
        return true;
    }
    if (dep.connection == ConnectionType::SELF) {
        return true;
    }
    if (dep.next < desiredGrantTime) {
        return false;
    }
    if ((dep.next == desiredGrantTime) && (dep.mTimeState == TimeState::time_granted)) {
        return false;
    }
    if (delayMode == GrantDelayMode::WAITING) {
        if (dep.mTimeState == TimeState::time_requested_iterative ||
            dep.mTimeState == TimeState::time_requested_require_iteration) {
            if (dep.sequenceCounter < dep.grantedIteration) {
                return false;
            }
        }
    }
    return true;
}